

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsConcatSpreadable(Var instanceVar)

{
  bool bVar1;
  BOOL BVar2;
  ThreadContext *this;
  JavascriptLibrary *pJVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *pRVar5;
  Var spreadable;
  RecyclableObject *pRStack_48;
  BOOL hasUserDefinedSpreadable;
  Var spreadable_1;
  IsConcatSpreadableCache *isConcatSpreadableCache;
  Type *instanceType;
  ScriptContext *pSStack_28;
  BOOL retVal;
  ScriptContext *scriptContext;
  RecyclableObject *instance;
  Var instanceVar_local;
  
  instance = (RecyclableObject *)instanceVar;
  BVar2 = IsObject(instanceVar);
  if (BVar2 == 0) {
    instanceVar_local._4_4_ = 0;
  }
  else {
    scriptContext = (ScriptContext *)UnsafeVarTo<Js::RecyclableObject>(instance);
    pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,IsConcatSpreadableCachePhase);
    if (bVar1) {
      pRVar5 = (RecyclableObject *)
               GetProperty((RecyclableObject *)scriptContext,0x13,pSStack_28,
                           (PropertyValueInfo *)0x0);
      pJVar3 = ScriptContext::GetLibrary(pSStack_28);
      pRVar4 = JavascriptLibraryBase::GetUndefined(&pJVar3->super_JavascriptLibraryBase);
      if (pRVar5 == pRVar4) {
        bVar1 = IsArray((RecyclableObject *)scriptContext);
        instanceVar_local._4_4_ = (uint)bVar1;
      }
      else {
        instanceVar_local._4_4_ = JavascriptConversion::ToBoolean(pRVar5,pSStack_28);
      }
    }
    else {
      instanceType._4_4_ = 0;
      isConcatSpreadableCache =
           (IsConcatSpreadableCache *)RecyclableObject::GetType((RecyclableObject *)scriptContext);
      this = ScriptContext::GetThreadContext(pSStack_28);
      spreadable_1 = ThreadContext::GetIsConcatSpreadableCache(this);
      bVar1 = IsConcatSpreadableCache::TryGetIsConcatSpreadable
                        ((IsConcatSpreadableCache *)spreadable_1,(Type *)isConcatSpreadableCache,
                         (BOOL *)((long)&instanceType + 4));
      if (bVar1) {
        Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache hit: %p\n",
                      isConcatSpreadableCache);
        instanceVar_local._4_4_ = instanceType._4_4_;
      }
      else {
        pRStack_48 = (RecyclableObject *)0x0;
        BVar2 = GetProperty(scriptContext,(RecyclableObject *)scriptContext,0x13,
                            &stack0xffffffffffffffb8,pSStack_28,(PropertyValueInfo *)0x0);
        pRVar5 = pRStack_48;
        if (BVar2 != 0) {
          pJVar3 = ScriptContext::GetLibrary(pSStack_28);
          pRVar4 = JavascriptLibraryBase::GetUndefined(&pJVar3->super_JavascriptLibraryBase);
          if (pRVar5 != pRVar4) {
            BVar2 = JavascriptConversion::ToBoolean(pRStack_48,pSStack_28);
            return BVar2;
          }
        }
        bVar1 = IsArray((RecyclableObject *)scriptContext);
        instanceType._4_4_ = (uint)bVar1;
        if (BVar2 == 0) {
          Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache saved: %p\n",
                        isConcatSpreadableCache);
          IsConcatSpreadableCache::CacheIsConcatSpreadable
                    ((IsConcatSpreadableCache *)spreadable_1,(Type *)isConcatSpreadableCache,
                     instanceType._4_4_);
        }
        instanceVar_local._4_4_ = instanceType._4_4_;
      }
    }
  }
  return instanceVar_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::IsConcatSpreadable(Var instanceVar)
    {
        // an object is spreadable under two condition, either it is a JsArray
        // or you define an isconcatSpreadable flag on it.
        if (!JavascriptOperators::IsObject(instanceVar))
        {
            return false;
        }

        RecyclableObject* instance = UnsafeVarTo<RecyclableObject>(instanceVar);
        ScriptContext* scriptContext = instance->GetScriptContext();

        if (!PHASE_OFF1(IsConcatSpreadableCachePhase))
        {
            BOOL retVal = FALSE;
            Type *instanceType = instance->GetType();
            IsConcatSpreadableCache *isConcatSpreadableCache = scriptContext->GetThreadContext()->GetIsConcatSpreadableCache();

            if (isConcatSpreadableCache->TryGetIsConcatSpreadable(instanceType, &retVal))
            {
                OUTPUT_TRACE(Phase::IsConcatSpreadableCachePhase, _u("IsConcatSpreadableCache hit: %p\n"), instanceType);
                return retVal;
            }

            Var spreadable = nullptr;
            BOOL hasUserDefinedSpreadable = JavascriptOperators::GetProperty(instance, instance, PropertyIds::_symbolIsConcatSpreadable, &spreadable, scriptContext);

            if (hasUserDefinedSpreadable && spreadable != scriptContext->GetLibrary()->GetUndefined())
            {
                return JavascriptConversion::ToBoolean(spreadable, scriptContext);
            }

            retVal = JavascriptOperators::IsArray(instance);

            if (!hasUserDefinedSpreadable)
            {
                OUTPUT_TRACE(Phase::IsConcatSpreadableCachePhase, _u("IsConcatSpreadableCache saved: %p\n"), instanceType);
                isConcatSpreadableCache->CacheIsConcatSpreadable(instanceType, retVal);
            }

            return retVal;
        }

        Var spreadable = JavascriptOperators::GetProperty(instance, PropertyIds::_symbolIsConcatSpreadable, scriptContext);
        if (spreadable != scriptContext->GetLibrary()->GetUndefined())
        {
            return JavascriptConversion::ToBoolean(spreadable, scriptContext);
        }

        return JavascriptOperators::IsArray(instance);
    }